

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrapTCPService.cpp
# Opt level: O0

AddSessionOptionFunc *
brynet::net::AddSessionOption::WithEnterCallback
          (AddSessionOptionFunc *__return_storage_ptr__,SESSION_ENTER_CALLBACK *callback)

{
  function<void_(const_std::shared_ptr<brynet::net::TCPSession>_&)> local_38;
  SESSION_ENTER_CALLBACK *local_18;
  SESSION_ENTER_CALLBACK *callback_local;
  
  local_18 = callback;
  callback_local = (SESSION_ENTER_CALLBACK *)__return_storage_ptr__;
  std::function<void_(const_std::shared_ptr<brynet::net::TCPSession>_&)>::function
            (&local_38,callback);
  std::function<void(brynet::net::AddSessionOption::Options&)>::
  function<brynet::net::AddSessionOption::WithEnterCallback(std::function<void(std::shared_ptr<brynet::net::TCPSession>const&)>)::__0,void>
            ((function<void(brynet::net::AddSessionOption::Options&)> *)__return_storage_ptr__,
             (anon_class_32_1_dda845c3 *)&local_38);
  WithEnterCallback(std::function<void(std::shared_ptr<brynet::net::TCPSession>const&)>)::$_0::~__0
            ((__0 *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

AddSessionOption::AddSessionOptionFunc AddSessionOption::WithEnterCallback(TCPSession::SESSION_ENTER_CALLBACK callback)
{
    return [=](AddSessionOption::Options& option) {
        option.enterCallback = callback;
    };
}